

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::HttpServer::Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined8 *puVar1;
  StringPtr *pSVar2;
  ArrayPtr<const_kj::StringPtr> connectionHeaders;
  char cVar3;
  byte bVar4;
  long lVar5;
  unsigned_long *extraout_RDX;
  unsigned_long *extraout_RDX_00;
  unsigned_long *params;
  size_t sVar6;
  undefined4 in_register_00000034;
  long lVar7;
  undefined4 in_register_00000084;
  HttpHeaders *in_R9;
  uint statusCode;
  char *pcVar8;
  HttpOutputStream *this_00;
  bool bVar9;
  StringPtr statusText;
  char *in_stack_00000008;
  Array<char> local_128;
  undefined8 *local_110;
  long *local_108;
  HttpHeaders *local_100;
  String lengthStr;
  Array<char> local_c0;
  StringPtr local_a8 [5];
  undefined8 local_58;
  long local_50;
  undefined8 local_48;
  long local_40 [2];
  
  statusText.content.size_._4_4_ = in_register_00000084;
  statusText.content.size_._0_4_ = __flags;
  lVar7 = CONCAT44(in_register_00000034,__fd);
  if (*(char *)(lVar7 + 0x148) == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1eae,FAILED,"currentMethod != nullptr","\"already called send()\"",
               (char (*) [22])"already called send()");
    kj::_::Debug::Fault::fatal((Fault *)local_a8);
  }
  local_108 = &local_50;
  local_110 = &local_58;
  bVar9 = *(int *)(lVar7 + 0x158) != 1 || *(int *)(lVar7 + 0x150) != 1;
  local_100 = in_R9;
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::operator=
            ((Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)(lVar7 + 0x148));
  lVar5 = 8;
  do {
    *(char **)((long)local_a8 + lVar5 + -8) = "";
    *(undefined8 *)((long)&local_a8[0].content.ptr + lVar5) = 1;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x78);
  lengthStr.content.disposer = (ArrayDisposer *)0x0;
  lengthStr.content.ptr = (char *)0x0;
  lengthStr.content.size_ = 0;
  bVar4 = *(byte *)(lVar7 + 0x164);
  params = extraout_RDX;
  if (bVar4 == 0) {
    if ((*(char *)(*(long *)(lVar7 + 0x18) + 0x70) != '\x01') ||
       (*(char *)(lVar7 + 0x165) == '\x01')) {
      puVar1 = *(undefined8 **)(*(long *)(lVar7 + 0x18) + 0x58);
      if (puVar1 != (undefined8 *)0x0) {
        cVar3 = (**(code **)*puVar1)();
        params = extraout_RDX_00;
        if (cVar3 != '\0') goto LAB_0033edd7;
        bVar4 = *(byte *)(lVar7 + 0x164);
      }
      goto LAB_0033ede8;
    }
LAB_0033edd7:
    *(undefined1 *)(lVar7 + 0x164) = 1;
LAB_0033edec:
    local_a8[0].content.ptr = "close";
    local_a8[0].content.size_ = 6;
  }
  else {
LAB_0033ede8:
    if ((bVar4 & 1) != 0) goto LAB_0033edec;
  }
  sVar6 = 7;
  statusCode = (uint)__buf;
  if (statusCode == 0xcc) {
LAB_0033eec8:
    if (bVar9) goto LAB_0033eee6;
  }
  else {
    if (statusCode == 0xcd) {
      lVar5 = 2;
      pcVar8 = "0";
      goto LAB_0033eeb8;
    }
    if (statusCode == 0x130) goto LAB_0033eec8;
    if (*in_stack_00000008 != '\x01') {
      lVar5 = 8;
      pcVar8 = "chunked";
      local_110 = &local_48;
      local_108 = local_40;
LAB_0033eeb8:
      *local_110 = pcVar8;
      *local_108 = lVar5;
      goto LAB_0033eec8;
    }
    if ((bVar9) || (*(long *)(in_stack_00000008 + 8) != 0)) {
      str<unsigned_long&>((String *)&local_128,(kj *)(in_stack_00000008 + 8),params);
      Array<char>::operator=(&lengthStr.content,&local_128);
      Array<char>::~Array(&local_128);
      pcVar8 = "";
      if (lengthStr.content.size_ != 0) {
        pcVar8 = lengthStr.content.ptr;
      }
      lVar5 = lengthStr.content.size_ + (lengthStr.content.size_ == 0);
      goto LAB_0033eeb8;
    }
  }
  pSVar2 = (local_100->indexedHeaders).ptr;
  if ((1 < pSVar2[5].content.size_) || (1 < pSVar2[6].content.size_)) {
    sVar6 = 5;
  }
LAB_0033eee6:
  connectionHeaders.size_ = sVar6;
  connectionHeaders.ptr = local_a8;
  statusText.content.ptr = (char *)__n;
  HttpHeaders::serializeResponse
            ((String *)&local_c0,local_100,statusCode,statusText,connectionHeaders);
  this_00 = (HttpOutputStream *)(lVar7 + 0x128);
  anon_unknown_36::HttpOutputStream::writeHeaders(this_00,(String *)&local_c0);
  Array<char>::~Array(&local_c0);
  if (bVar9) {
    if ((statusCode - 0xcc < 2) || (statusCode == 0x130)) {
      anon_unknown_36::HttpOutputStream::finishBody(this_00);
      heap<kj::(anonymous_namespace)::HttpNullEntityWriter>();
      (this->super_Response)._vptr_Response = (_func_int **)local_128.ptr;
      (this->super_ConnectResponse)._vptr_ConnectResponse = (_func_int **)local_128.size_;
      local_128.size_ = 0;
      Own<kj::(anonymous_namespace)::HttpNullEntityWriter,_std::nullptr_t>::~Own
                ((Own<kj::(anonymous_namespace)::HttpNullEntityWriter,_std::nullptr_t> *)&local_128)
      ;
    }
    else if (*in_stack_00000008 == '\x01') {
      heap<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&,unsigned_long&>
                ((kj *)&local_128,this_00,(unsigned_long *)(in_stack_00000008 + 8));
      (this->super_Response)._vptr_Response = (_func_int **)local_128.ptr;
      (this->super_ConnectResponse)._vptr_ConnectResponse = (_func_int **)local_128.size_;
      local_128.size_ = 0;
      Own<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,_std::nullptr_t>::~Own
                ((Own<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,_std::nullptr_t> *)
                 &local_128);
    }
    else {
      heap<kj::(anonymous_namespace)::HttpChunkedEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&>
                ((kj *)&local_128,this_00);
      (this->super_Response)._vptr_Response = (_func_int **)local_128.ptr;
      (this->super_ConnectResponse)._vptr_ConnectResponse = (_func_int **)local_128.size_;
      local_128.size_ = 0;
      Own<kj::(anonymous_namespace)::HttpChunkedEntityWriter,_std::nullptr_t>::~Own
                ((Own<kj::(anonymous_namespace)::HttpChunkedEntityWriter,_std::nullptr_t> *)
                 &local_128);
    }
  }
  else {
    anon_unknown_36::HttpOutputStream::finishBody(this_00);
    heap<kj::(anonymous_namespace)::HttpDiscardingEntityWriter>();
    (this->super_Response)._vptr_Response = (_func_int **)local_128.ptr;
    (this->super_ConnectResponse)._vptr_ConnectResponse = (_func_int **)local_128.size_;
    local_128.size_ = 0;
    Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t>::~Own
              ((Own<kj::(anonymous_namespace)::HttpDiscardingEntityWriter,_std::nullptr_t> *)
               &local_128);
  }
  Array<char>::~Array(&lengthStr.content);
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
      uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
      kj::Maybe<uint64_t> expectedBodySize) override {
    auto method = KJ_REQUIRE_NONNULL(currentMethod, "already called send()");
    currentMethod = kj::none;

    kj::StringPtr connectionHeaders[HttpHeaders::CONNECTION_HEADERS_COUNT];
    kj::String lengthStr;

    if (!closeAfterSend) {
      // Check if application wants us to close connections.
      //
      // If the application used listenHttpCleanDrain() to listen, then it expects that after a
      // clean drain, the connection is still open and can receive more requests. Otherwise, after
      // receiving drain(), we will close the connection, so we should send a `Connection: close`
      // header.
      if (server.draining && !wantCleanDrain) {
        closeAfterSend = true;
      } else KJ_IF_SOME(c, server.settings.callbacks) {
        // The application has registered its own callback to decide whether to send
        // `Connection: close`.
        if (c.shouldClose()) {
          closeAfterSend = true;
        }
      }
    }

    if (closeAfterSend) {
      connectionHeaders[HttpHeaders::BuiltinIndices::CONNECTION] = "close";
    }

    bool isHeadRequest = method.tryGet<HttpMethod>().map([](auto& m) {
        return m == HttpMethod::HEAD;
      }).orDefault(false);

    if (statusCode == 204 || statusCode == 304) {
      // No entity-body.
    } else if (statusCode == 205) {
      // Status code 205 also has no body, but unlike 204 and 304, it must explicitly encode an
      // empty body, e.g. using content-length: 0. I'm guessing this is one of those things,
      // where some early clients expected an explicit body while others assumed an empty body,
      // and so the standard had to choose the common denominator.
      //
      // Spec: https://tools.ietf.org/html/rfc7231#section-6.3.6
      connectionHeaders[HttpHeaders::BuiltinIndices::CONTENT_LENGTH] = "0";
    } else KJ_IF_SOME(s, expectedBodySize) {
      // HACK: We interpret a zero-length expected body length on responses to HEAD requests to
      //   mean "don't set a Content-Length header at all." This provides a way to omit a body
      //   header on HEAD responses with non-null-body status codes. This is a hack that *only*
      //   makes sense for HEAD responses.
      if (!isHeadRequest || s > 0) {
        lengthStr = kj::str(s);
        connectionHeaders[HttpHeaders::BuiltinIndices::CONTENT_LENGTH] = lengthStr;
      }
    } else {
      connectionHeaders[HttpHeaders::BuiltinIndices::TRANSFER_ENCODING] = "chunked";
    }